

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O2

void __thiscall
libtorrent::torrent_info::torrent_info(torrent_info *this,string *filename,error_code *ec)

{
  vector<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_> *pvVar1;
  int iVar2;
  span<const_char> buffer;
  int in_stack_ffffffffffffff10;
  vector<char,_std::allocator<char>_> buf;
  bdecode_node e;
  load_torrent_limits local_48;
  
  file_storage::file_storage(&this->m_files);
  memset(&this->m_orig_files,0,0xf0);
  (this->m_comment)._M_dataplus._M_p = (pointer)&(this->m_comment).field_2;
  (this->m_comment)._M_string_length = 0;
  (this->m_comment).field_2._M_local_buf[0] = '\0';
  (this->m_created_by)._M_dataplus._M_p = (pointer)&(this->m_created_by).field_2;
  (this->m_created_by)._M_string_length = 0;
  (this->m_created_by).field_2._M_local_buf[0] = '\0';
  pvVar1 = &(this->m_info_dict).m_tokens;
  (pvVar1->
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar1->
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->m_info_dict).m_tokens.
    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&(this->m_info_dict).m_root_tokens + 4) = (undefined1  [16])0x0;
  (this->m_info_dict).m_token_idx = -1;
  (this->m_info_dict).m_last_index = -1;
  (this->m_info_dict).m_last_token = -1;
  (this->m_info_dict).m_size = -1;
  this->m_creation_date = 0;
  info_hash_t::info_hash_t(&this->m_info_hash);
  (this->m_flags).m_val = '\0';
  this->m_piece_hashes = 0;
  this->m_info_section_size = 0;
  buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar2 = anon_unknown_1::load_file(filename,&buf,ec,80000000);
  if (-1 < iVar2) {
    buffer.m_ptr = buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish +
                   -(long)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start;
    buffer.m_len = (difference_type)ec;
    bdecode(&e,(libtorrent *)
               buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start,buffer,(error_code *)0x0,(int *)0x64,2000000,in_stack_ffffffffffffff10);
    if (ec->failed_ == false) {
      local_48.max_buffer_size = 10000000;
      local_48.max_pieces = 0x200000;
      local_48.max_decode_depth = 100;
      local_48.max_decode_tokens = 3000000;
      local_48.max_duplicate_filenames = 500;
      parse_torrent_file(this,&e,ec,&local_48);
    }
    ::std::
    _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
    ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   *)&e);
  }
  ::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&buf.super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

torrent_info::torrent_info(std::string const& filename, error_code& ec)
	{
		std::vector<char> buf;
		int ret = load_file(filename, buf, ec);
		if (ret < 0) return;

		bdecode_node e = bdecode(buf, ec);
		if (ec) return;
		parse_torrent_file(e, ec, load_torrent_limits{});

		INVARIANT_CHECK;
	}